

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

MacroDef __thiscall slang::parsing::Preprocessor::findMacro(Preprocessor *this,Token directive)

{
  MacroDef MVar1;
  bool bVar2;
  const_reference pvVar3;
  pointer ppVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  iterator it;
  string_view name;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe88;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *in_stack_fffffffffffffe90;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  Token *in_stack_fffffffffffffea0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *__y;
  size_type in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *__x;
  undefined1 local_108 [48];
  undefined8 local_d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *local_d0;
  char **local_c8;
  char_pointer local_c0;
  table_element_pointer local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
  local_b0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *local_98;
  char **local_90;
  iterator local_88;
  size_t local_78;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *local_70;
  char **local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
  *local_10;
  basic_string_view<char,_std::char_traits<char>_> *local_8;
  
  Token::valueText(in_stack_fffffffffffffea0);
  local_108._0_16_ =
       (undefined1  [16])
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (in_RDI,in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_108);
  if ((!bVar2) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_108,0),
     *pvVar3 == '\\')) {
    local_108._0_16_ =
         (undefined1  [16])
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (in_RDI,in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0);
  }
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[0x16]._M_str;
  local_d0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              *)local_108;
  local_c8 = (char **)this_00;
  local_98 = local_d0;
  local_90 = (char **)this_00;
  local_70 = local_d0;
  local_68 = (char **)this_00;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
             ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  __y = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
             ::position_for(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  local_20 = local_78;
  __x = this_00;
  local_10 = __y;
  local_8 = this_00;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
               ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                         *)0x36bde2);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)this_00,
                       (size_t)in_stack_fffffffffffffe90);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                             *)0x36be2d);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffe88 =
             (basic_string_view<char,_std::char_traits<char>_> *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                     *)0x36be7d);
        in_stack_fffffffffffffe90 = local_10;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                    *)0x36bea9);
        bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           in_RDI,__x,(basic_string_view<char,_std::char_traits<char>_> *)__y);
        if (bVar2) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_0036bf9c;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    if (bVar2) break;
    bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,(size_t)__x->_M_str);
    if (!bVar2) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
      ::table_locator(&local_b0);
LAB_0036bf9c:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 ::make_iterator((locator *)0x36bfa9);
      local_c0 = local_88.pc_;
      local_b8 = local_88.p_;
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
             *)0x36c004);
      bVar2 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffe90,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffe88);
      if (bVar2) {
        MacroDef::MacroDef((MacroDef *)(local_108 + 0x28),(DefineDirectiveSyntax *)0x0);
      }
      else {
        ppVar4 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)0x36c040);
        local_108._40_8_ = (ppVar4->second).syntax;
        local_d8._0_4_ = (ppVar4->second).intrinsic;
        local_d8._4_1_ = (ppVar4->second).builtIn;
        local_d8._5_1_ = (ppVar4->second).commandLine;
        local_d8._6_2_ = *(undefined2 *)&(ppVar4->second).field_0xe;
      }
      MVar1.intrinsic = (undefined4)local_d8;
      MVar1.builtIn = (bool)local_d8._4_1_;
      MVar1.commandLine = (bool)local_d8._5_1_;
      MVar1._14_2_ = local_d8._6_2_;
      MVar1.syntax = (DefineDirectiveSyntax *)local_108._40_8_;
      return MVar1;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>
  ::table_locator(&local_b0);
  goto LAB_0036bf9c;
}

Assistant:

Preprocessor::MacroDef Preprocessor::findMacro(Token directive) {
    std::string_view name = directive.valueText().substr(1);
    if (!name.empty() && name[0] == '\\')
        name = name.substr(1);

    auto it = macros.find(name);
    if (it == macros.end())
        return nullptr;
    return it->second;
}